

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ClientHook **__return_storage_ptr__;
  Reader value;
  Reader reader;
  bool bVar1;
  uint16_t uVar2;
  RpcConnectionState *pRVar3;
  RpcClient *pRVar4;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar5;
  ClientHook *pCVar6;
  uint64_t uVar7;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *params_1;
  Promise<capnp::Response<capnp::AnyPointer>_> *promise;
  Own<capnp::PipelineHook,_std::nullptr_t> *hook;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  Exception *this_00;
  int __flags_00;
  Maybe<capnp::MessageSize> *pMVar8;
  MessageSize MVar9;
  undefined8 in_stack_fffffffffffffa08;
  Pipeline local_560;
  Promise<capnp::Response<capnp::AnyPointer>_> local_530;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2436:13),_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse>_>
  appPromise;
  undefined1 local_520 [8];
  undefined1 local_518 [64];
  undefined1 local_4d8 [8];
  ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  forkedPromise;
  undefined1 local_4b8 [8];
  Own<capnp::PipelineHook,_std::nullptr_t> pipeline;
  SendInternalResult sendResult;
  undefined1 auStack_488 [3];
  bool noPromisePipelining;
  CapTableReader *pCStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  Reader local_468;
  undefined2 local_432;
  MessageSize local_430;
  Maybe<capnp::MessageSize> local_420;
  undefined1 local_408 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  Own<capnp::ClientHook,_std::nullptr_t> *redirect;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_3b0;
  undefined1 local_3a0 [8];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _redirect2408;
  Own<capnp::PipelineHook,_std::nullptr_t> local_200;
  Pipeline local_1f0;
  Exception local_1b8;
  Promise<capnp::Response<capnp::AnyPointer>_> local_28;
  Exception *local_20;
  Exception *e;
  RpcRequest *this_local;
  
  this_00 = (Exception *)CONCAT44(in_register_00000034,__fd);
  e = this_00;
  this_local = this;
  pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                      &(this_00->ownFile).content.disposer);
  bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
          is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar3->connection);
  if (bVar1) {
    pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::
             operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                         *)&this_00->line);
    rpc::Call::Builder::getTarget((Builder *)&redirect,(Builder *)this_00->trace);
    (*(pRVar4->super_ClientHook)._vptr_ClientHook[10])();
    kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>((_ *)local_3a0,&local_3b0);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(&local_3b0);
    pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_3a0);
    if (pOVar5 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
      sendResult.promise.super_PromiseBase.node.ptr._3_1_ =
           rpc::Call::Builder::getNoPromisePipelining((Builder *)this_00->trace);
      sendInternal((SendInternalResult *)&pipeline.ptr,(RpcRequest *)this_00,false);
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::Own
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_4b8);
      if ((sendResult.promise.super_PromiseBase.node.ptr._3_1_ & 1) == 0) {
        kj::SourceLocation::SourceLocation
                  ((SourceLocation *)(local_518 + 0x28),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,&DAT_00a3c8b6,0x97a,0x20);
        kj::
        Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::fork((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                *)local_4d8);
        params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                           ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                            &(this_00->ownFile).content.disposer);
        params_1 = kj::
                   mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                             ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                               *)&pipeline.ptr);
        kj::
        ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::addBranch((ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)local_520);
        kj::
        refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
                  ((kj *)local_518,params,params_1,
                   (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                    *)local_520);
        kj::Own<capnp::PipelineHook,decltype(nullptr)>::
        Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,void>
                  ((Own<capnp::PipelineHook,decltype(nullptr)> *)(local_518 + 0x10),
                   (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
                   local_518);
        kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator=
                  ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_4b8,
                   (Own<capnp::PipelineHook,_std::nullptr_t> *)(local_518 + 0x10));
        kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own
                  ((Own<capnp::PipelineHook,_std::nullptr_t> *)(local_518 + 0x10));
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::~Own
                  ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
                   local_518);
        kj::
        Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::~Promise((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                    *)local_520);
        kj::
        ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::addBranch((ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)&appPromise);
        kj::
        Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::operator=((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)&sendResult.questionRef.ptr,
                    (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                     *)&appPromise);
        kj::
        Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::~Promise((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                    *)&appPromise);
        kj::
        ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
        ::~ForkedPromise((ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                          *)local_4d8);
      }
      else {
        getDisabledPipeline();
        kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator=
                  ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_4b8,
                   (Own<capnp::PipelineHook,_std::nullptr_t> *)&forkedPromise.hub.ptr);
        kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own
                  ((Own<capnp::PipelineHook,_std::nullptr_t> *)&forkedPromise.hub.ptr);
      }
      kj::
      Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>::
      then<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_>
                ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                  *)&local_530,(Type *)&sendResult.questionRef.ptr);
      promise = kj::mv<kj::Promise<capnp::Response<capnp::AnyPointer>>>(&local_530);
      hook = kj::mv<kj::Own<capnp::PipelineHook,decltype(nullptr)>>
                       ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_4b8);
      AnyPointer::Pipeline::Pipeline(&local_560,hook);
      RemotePromise<capnp::AnyPointer>::RemotePromise
                ((RemotePromise<capnp::AnyPointer> *)this,promise,&local_560);
      AnyPointer::Pipeline::~Pipeline(&local_560);
      sendResult.promise.super_PromiseBase.node.ptr._4_4_ = 1;
      kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise(&local_530);
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_4b8);
      SendInternalResult::~SendInternalResult((SendInternalResult *)&pipeline.ptr);
    }
    else {
      replacement.hook.ptr =
           (RequestHook *)
           kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::operator*
                     ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_3a0);
      pCVar6 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                         ((Own<capnp::ClientHook,_std::nullptr_t> *)replacement.hook.ptr);
      uVar7 = rpc::Call::Builder::getInterfaceId((Builder *)this_00->trace);
      uVar2 = rpc::Call::Builder::getMethodId((Builder *)this_00->trace);
      MVar9 = AnyPointer::Builder::targetSize((Builder *)((Builder *)this_00->trace + 1));
      local_430.wordCount = MVar9.wordCount;
      local_430.capCount = MVar9.capCount;
      kj::Maybe<capnp::MessageSize>::Maybe(&local_420,&local_430);
      rpc::Call::Builder::operator_cast_to_Reader(&local_468,(Builder *)this_00->trace);
      reader._reader.capTable._0_4_ = (int)local_468._reader.data;
      reader._reader.segment = (SegmentReader *)local_468._reader.capTable;
      reader._reader.capTable._4_4_ = (int)((ulong)local_468._reader.data >> 0x20);
      reader._reader.data._0_4_ = (int)local_468._reader.pointers;
      reader._reader.data._4_4_ = (int)((ulong)local_468._reader.pointers >> 0x20);
      reader._reader.pointers = (WirePointer *)local_468._reader._32_8_;
      reader._reader.dataSize = local_468._reader.nestingLimit;
      reader._reader.pointerCount = local_468._reader._44_2_;
      reader._reader._38_2_ = local_468._reader._46_2_;
      reader._reader._40_8_ = in_stack_fffffffffffffa08;
      local_432 = anon_unknown_18::callHintsFromReader(reader);
      __n_00 = (size_t)uVar2;
      pMVar8 = &local_420;
      (**pCVar6->_vptr_ClientHook)(local_408,pCVar6,uVar7,__n_00,pMVar8,(ulong)(ushort)local_432);
      __flags_00 = (int)pMVar8;
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_420);
      AnyPointer::Builder::operator_cast_to_Reader
                ((Reader *)auStack_488,(Builder *)((Builder *)this_00->trace + 1));
      value.reader.capTable._0_4_ = (int)pCStack_480;
      value.reader.segment = (SegmentReader *)_auStack_488;
      value.reader.capTable._4_4_ = (int)((ulong)pCStack_480 >> 0x20);
      value.reader.pointer._0_4_ = (int)local_478;
      value.reader.pointer._4_4_ = (int)((ulong)local_478 >> 0x20);
      value.reader.nestingLimit = (int)uStack_470;
      value.reader._28_4_ = (int)((ulong)uStack_470 >> 0x20);
      AnyPointer::Builder::set((Builder *)local_408,value);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_408,__buf_00,
                 __n_00,__flags_00);
      sendResult.promise.super_PromiseBase.node.ptr._4_4_ = 1;
      Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_408);
    }
    kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_3a0);
  }
  else {
    pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                        &(this_00->ownFile).content.disposer);
    local_20 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
               get<kj::Exception>(&pRVar3->connection);
    kj::cp<kj::Exception>(&local_1b8,local_20);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise(&local_28,&local_1b8);
    __return_storage_ptr__ = &_redirect2408.value.ptr;
    kj::cp<kj::Exception>((Exception *)__return_storage_ptr__,local_20);
    newBrokenPipeline((capnp *)&local_200,(Exception *)__return_storage_ptr__);
    AnyPointer::Pipeline::Pipeline(&local_1f0,&local_200);
    RemotePromise<capnp::AnyPointer>::RemotePromise
              ((RemotePromise<capnp::AnyPointer> *)this,&local_28,&local_1f0);
    AnyPointer::Pipeline::~Pipeline(&local_1f0);
    kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_200);
    kj::Exception::~Exception((Exception *)&_redirect2408.value.ptr);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise(&local_28);
    kj::Exception::~Exception(&local_1b8);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        bool noPromisePipelining = callBuilder.getNoPromisePipelining();

        auto sendResult = sendInternal(false);

        kj::Own<PipelineHook> pipeline;
        if (noPromisePipelining) {
          pipeline = getDisabledPipeline();
        } else {
          auto forkedPromise = sendResult.promise.fork();

          // The pipeline must get notified of resolution before the app does to maintain ordering.
          pipeline = kj::refcounted<RpcPipeline>(
              *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

          sendResult.promise = forkedPromise.addBranch();
        }

        auto appPromise = sendResult.promise.then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }